

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_set_load_balancer_ht_tp_slistener_attribute(void)

{
  code *pcVar1;
  char *__s;
  SlbSetLoadBalancerHTTPSListenerAttributeRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_3f1;
  int ret;
  HttpTestListener *local_3d0;
  HttpTestListener *listener;
  string local_3c0;
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [55];
  allocator<char> local_339;
  string local_338 [32];
  SlbSetLoadBalancerHTTPSListenerAttributeRequestType *local_318;
  Slb *slb;
  undefined1 local_308 [7];
  SlbSetLoadBalancerHTTPSListenerAttributeResponseType resp;
  SlbSetLoadBalancerHTTPSListenerAttributeRequestType req;
  
  aliyun::SlbSetLoadBalancerHTTPSListenerAttributeRequestType::
  SlbSetLoadBalancerHTTPSListenerAttributeRequestType
            ((SlbSetLoadBalancerHTTPSListenerAttributeRequestType *)local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"cn-hangzhou",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"my_appid",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"my_secret",&local_399);
  pSVar2 = (SlbSetLoadBalancerHTTPSListenerAttributeRequestType *)
           aliyun::Slb::CreateSlbClient(local_338,local_370,local_398);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  local_318 = pSVar2;
  if (pSVar2 == (SlbSetLoadBalancerHTTPSListenerAttributeRequestType *)0x0) {
    aliyun::SlbSetLoadBalancerHTTPSListenerAttributeRequestType::
    ~SlbSetLoadBalancerHTTPSListenerAttributeRequestType
              ((SlbSetLoadBalancerHTTPSListenerAttributeRequestType *)local_308);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_318,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_set_load_balancer_ht_tp_slistener_attribute_response;
  local_3d0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_3f1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_3f1);
  HttpTestListener::Start(local_3d0);
  std::__cxx11::string::operator=((string *)local_308,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"LoadBalancerId");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_id.field_2._M_local_buf + 8),"ListenerPort");
  std::__cxx11::string::operator=
            ((string *)(req.listener_port.field_2._M_local_buf + 8),"Bandwidth");
  std::__cxx11::string::operator=
            ((string *)(req.bandwidth.field_2._M_local_buf + 8),"XForwardedFor");
  std::__cxx11::string::operator=
            ((string *)(req.xforwarded_for.field_2._M_local_buf + 8),"Scheduler");
  std::__cxx11::string::operator=
            ((string *)(req.scheduler.field_2._M_local_buf + 8),"StickySession");
  std::__cxx11::string::operator=
            ((string *)(req.sticky_session.field_2._M_local_buf + 8),"StickySessionType");
  std::__cxx11::string::operator=
            ((string *)(req.sticky_session_type.field_2._M_local_buf + 8),"CookieTimeout");
  std::__cxx11::string::operator=((string *)(req.cookie_timeout.field_2._M_local_buf + 8),"Cookie");
  std::__cxx11::string::operator=((string *)(req.cookie.field_2._M_local_buf + 8),"HealthCheck");
  std::__cxx11::string::operator=
            ((string *)(req.health_check.field_2._M_local_buf + 8),"HealthCheckDomain");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_domain.field_2._M_local_buf + 8),"HealthCheckURI");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_ur_i.field_2._M_local_buf + 8),"HealthyThreshold");
  std::__cxx11::string::operator=
            ((string *)(req.healthy_threshold.field_2._M_local_buf + 8),"UnhealthyThreshold");
  std::__cxx11::string::operator=
            ((string *)(req.unhealthy_threshold.field_2._M_local_buf + 8),"HealthCheckTimeout");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_timeout.field_2._M_local_buf + 8),"HealthCheckInterval");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_interval.field_2._M_local_buf + 8),"HealthCheckConnectPort"
            );
  std::__cxx11::string::operator=
            ((string *)(req.health_check_connect_port.field_2._M_local_buf + 8),
             "HealthCheckHttpCode");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_http_code.field_2._M_local_buf + 8),"ServerCertificateId");
  std::__cxx11::string::operator=
            ((string *)(req.server_certificate_id.field_2._M_local_buf + 8),"MaxConnLimit");
  std::__cxx11::string::operator=
            ((string *)(req.max_conn_limit.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::SetLoadBalancerHTTPSListenerAttribute
            (local_318,(SlbSetLoadBalancerHTTPSListenerAttributeResponseType *)local_308,
             (SlbErrorInfo *)((long)&slb + 7));
  HttpTestListener::WaitComplete(local_3d0);
  pHVar3 = local_3d0;
  if (local_3d0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_3d0);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_318;
  if (local_318 != (SlbSetLoadBalancerHTTPSListenerAttributeRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_318);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_set_load_balancer_ht_tp_slistener_attribute() {
  SlbSetLoadBalancerHTTPSListenerAttributeRequestType req;
  SlbSetLoadBalancerHTTPSListenerAttributeResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_set_load_balancer_ht_tp_slistener_attribute_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.load_balancer_id = "LoadBalancerId";
  req.listener_port = "ListenerPort";
  req.bandwidth = "Bandwidth";
  req.xforwarded_for = "XForwardedFor";
  req.scheduler = "Scheduler";
  req.sticky_session = "StickySession";
  req.sticky_session_type = "StickySessionType";
  req.cookie_timeout = "CookieTimeout";
  req.cookie = "Cookie";
  req.health_check = "HealthCheck";
  req.health_check_domain = "HealthCheckDomain";
  req.health_check_ur_i = "HealthCheckURI";
  req.healthy_threshold = "HealthyThreshold";
  req.unhealthy_threshold = "UnhealthyThreshold";
  req.health_check_timeout = "HealthCheckTimeout";
  req.health_check_interval = "HealthCheckInterval";
  req.health_check_connect_port = "HealthCheckConnectPort";
  req.health_check_http_code = "HealthCheckHttpCode";
  req.server_certificate_id = "ServerCertificateId";
  req.max_conn_limit = "MaxConnLimit";
  req.owner_account = "OwnerAccount";
  int ret = slb->SetLoadBalancerHTTPSListenerAttribute(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}